

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyOper.c
# Opt level: O0

Ivy_Obj_t * Ivy_Mux(Ivy_Man_t *p,Ivy_Obj_t *pC,Ivy_Obj_t *p1,Ivy_Obj_t *p0)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *local_118;
  Ivy_Obj_t *local_100;
  Ivy_Obj_t *local_f0;
  Ivy_Obj_t *local_e8;
  int Count1;
  int Count0;
  Ivy_Obj_t *pTemp;
  Ivy_Obj_t *pTempB2;
  Ivy_Obj_t *pTempB1;
  Ivy_Obj_t *pTempA2;
  Ivy_Obj_t *pTempA1;
  Ivy_Obj_t *p0_local;
  Ivy_Obj_t *p1_local;
  Ivy_Obj_t *pC_local;
  Ivy_Man_t *p_local;
  
  pIVar1 = Ivy_Not(p1);
  if (p0 == pIVar1) {
    p_local = (Ivy_Man_t *)Ivy_Exor(p,pC,p0);
  }
  else {
    pIVar1 = Ivy_ObjCreateGhost(p,pC,p1,IVY_AND,IVY_INIT_NONE);
    local_e8 = Ivy_TableLookup(p,pIVar1);
    pIVar1 = Ivy_Not(pC);
    pIVar1 = Ivy_ObjCreateGhost(p,pIVar1,p0,IVY_AND,IVY_INIT_NONE);
    local_f0 = Ivy_TableLookup(p,pIVar1);
    if ((local_e8 != (Ivy_Obj_t *)0x0) && (local_f0 != (Ivy_Obj_t *)0x0)) {
      pIVar1 = Ivy_Not(local_e8);
      pIVar2 = Ivy_Not(local_f0);
      pIVar1 = Ivy_ObjCreateGhost(p,pIVar1,pIVar2,IVY_AND,IVY_INIT_NONE);
      pIVar1 = Ivy_TableLookup(p,pIVar1);
      if (pIVar1 != (Ivy_Obj_t *)0x0) {
        pIVar1 = Ivy_Not(pIVar1);
        return pIVar1;
      }
    }
    pIVar1 = Ivy_Not(p1);
    pIVar1 = Ivy_ObjCreateGhost(p,pC,pIVar1,IVY_AND,IVY_INIT_NONE);
    local_100 = Ivy_TableLookup(p,pIVar1);
    pIVar1 = Ivy_Not(pC);
    pIVar2 = Ivy_Not(p0);
    pIVar1 = Ivy_ObjCreateGhost(p,pIVar1,pIVar2,IVY_AND,IVY_INIT_NONE);
    local_118 = Ivy_TableLookup(p,pIVar1);
    if ((local_100 != (Ivy_Obj_t *)0x0) && (local_118 != (Ivy_Obj_t *)0x0)) {
      pIVar1 = Ivy_Not(local_100);
      pIVar2 = Ivy_Not(local_118);
      pIVar1 = Ivy_ObjCreateGhost(p,pIVar1,pIVar2,IVY_AND,IVY_INIT_NONE);
      pIVar1 = Ivy_TableLookup(p,pIVar1);
      if (pIVar1 != (Ivy_Obj_t *)0x0) {
        return pIVar1;
      }
    }
    if ((byte)((local_e8 != (Ivy_Obj_t *)0x0) + (local_f0 != (Ivy_Obj_t *)0x0)) <
        (byte)((local_100 != (Ivy_Obj_t *)0x0) + (local_118 != (Ivy_Obj_t *)0x0))) {
      if (local_100 == (Ivy_Obj_t *)0x0) {
        pIVar1 = Ivy_Not(p1);
        local_100 = Ivy_And(p,pC,pIVar1);
      }
      if (local_118 == (Ivy_Obj_t *)0x0) {
        pIVar1 = Ivy_Not(pC);
        pIVar2 = Ivy_Not(p0);
        local_118 = Ivy_And(p,pIVar1,pIVar2);
      }
      pIVar1 = Ivy_Or(p,local_100,local_118);
      p_local = (Ivy_Man_t *)Ivy_Not(pIVar1);
    }
    else {
      if (local_e8 == (Ivy_Obj_t *)0x0) {
        local_e8 = Ivy_And(p,pC,p1);
      }
      if (local_f0 == (Ivy_Obj_t *)0x0) {
        pIVar1 = Ivy_Not(pC);
        local_f0 = Ivy_And(p,pIVar1,p0);
      }
      p_local = (Ivy_Man_t *)Ivy_Or(p,local_e8,local_f0);
    }
  }
  return (Ivy_Obj_t *)p_local;
}

Assistant:

Ivy_Obj_t * Ivy_Mux( Ivy_Man_t * p, Ivy_Obj_t * pC, Ivy_Obj_t * p1, Ivy_Obj_t * p0 )
{
    Ivy_Obj_t * pTempA1, * pTempA2, * pTempB1, * pTempB2, * pTemp;
    int Count0, Count1;
    // consider trivial cases
    if ( p0 == Ivy_Not(p1) )
        return Ivy_Exor( p, pC, p0 );
    // other cases can be added
    // implement the first MUX (F = C * x1 + C' * x0)
    pTempA1 = Ivy_TableLookup( p, Ivy_ObjCreateGhost(p, pC,          p1, IVY_AND, IVY_INIT_NONE) );
    pTempA2 = Ivy_TableLookup( p, Ivy_ObjCreateGhost(p, Ivy_Not(pC), p0, IVY_AND, IVY_INIT_NONE) );
    if ( pTempA1 && pTempA2 )
    {
        pTemp = Ivy_TableLookup( p, Ivy_ObjCreateGhost(p, Ivy_Not(pTempA1), Ivy_Not(pTempA2), IVY_AND, IVY_INIT_NONE) );
        if ( pTemp ) return Ivy_Not(pTemp);
    }
    Count0 = (pTempA1 != NULL) + (pTempA2 != NULL);
    // implement the second MUX (F' = C * x1' + C' * x0')
    pTempB1 = Ivy_TableLookup( p, Ivy_ObjCreateGhost(p, pC,          Ivy_Not(p1), IVY_AND, IVY_INIT_NONE) );
    pTempB2 = Ivy_TableLookup( p, Ivy_ObjCreateGhost(p, Ivy_Not(pC), Ivy_Not(p0), IVY_AND, IVY_INIT_NONE) );
    if ( pTempB1 && pTempB2 )
    {
        pTemp = Ivy_TableLookup( p, Ivy_ObjCreateGhost(p, Ivy_Not(pTempB1), Ivy_Not(pTempB2), IVY_AND, IVY_INIT_NONE) );
        if ( pTemp ) return pTemp;
    }
    Count1 = (pTempB1 != NULL) + (pTempB2 != NULL);
    // compare and decide which one to implement
    if ( Count0 >= Count1 )
    {
        pTempA1 = pTempA1? pTempA1 : Ivy_And(p, pC,          p1);
        pTempA2 = pTempA2? pTempA2 : Ivy_And(p, Ivy_Not(pC), p0);
        return Ivy_Or( p, pTempA1, pTempA2 );
    }
    pTempB1 = pTempB1? pTempB1 : Ivy_And(p, pC,          Ivy_Not(p1));
    pTempB2 = pTempB2? pTempB2 : Ivy_And(p, Ivy_Not(pC), Ivy_Not(p0));
    return Ivy_Not( Ivy_Or( p, pTempB1, pTempB2 ) );

//    return Ivy_Or( Ivy_And(pC, p1), Ivy_And(Ivy_Not(pC), p0) );
}